

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O1

void google::protobuf::
     STLDeleteElements<std::vector<google::protobuf::GoogleOnceDynamic*,std::allocator<google::protobuf::GoogleOnceDynamic*>>>
               (vector<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
                *container)

{
  pointer ppGVar1;
  __normal_iterator<google::protobuf::GoogleOnceDynamic_**,_std::vector<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>_>
  temp;
  pointer ppGVar2;
  
  if (container !=
      (vector<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
       *)0x0) {
    ppGVar1 = (container->
              super__Vector_base<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppGVar2 = (container->
                   super__Vector_base<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppGVar2 != ppGVar1;
        ppGVar2 = ppGVar2 + 1) {
      if (*ppGVar2 != (GoogleOnceDynamic *)0x0) {
        operator_delete(*ppGVar2,8);
      }
    }
    ppGVar2 = (container->
              super__Vector_base<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((container->
        super__Vector_base<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
        )._M_impl.super__Vector_impl_data._M_finish != ppGVar2) {
      (container->
      super__Vector_base<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
      )._M_impl.super__Vector_impl_data._M_finish = ppGVar2;
    }
  }
  return;
}

Assistant:

void STLDeleteElements(T *container) {
  if (!container) return;
  STLDeleteContainerPointers(container->begin(), container->end());
  container->clear();
}